

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdf_test.cpp
# Opt level: O0

void __thiscall SDF_CubeVoid_Test::TestBody(SDF_CubeVoid_Test *this)

{
  vec3 p;
  vec3 p_00;
  vec3 p_01;
  vec3 p_02;
  vec3 p_03;
  vec3 p_04;
  vec3 p_05;
  vec3 p_06;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_328;
  Message local_320;
  int local_314;
  double local_310;
  double local_308;
  double local_300;
  vec<double,_3> local_2f8;
  double local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_7;
  Message local_2c0;
  int local_2b4;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  vec<double,_3> local_298;
  double local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_6;
  Message local_260;
  int local_254;
  double local_250;
  double local_248;
  double local_240;
  vec<double,_3> local_238;
  double local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  Message local_200;
  int local_1f4;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  vec<double,_3> local_1d8;
  double local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_4;
  Message local_1a0;
  int local_194;
  double local_190;
  double local_188;
  double local_180;
  vec<double,_3> local_178;
  double local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  int local_134;
  double local_130;
  double local_128;
  double local_120;
  vec<double,_3> local_118;
  double local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  int local_d4;
  double local_d0;
  double local_c8;
  double local_c0;
  vec<double,_3> local_b8;
  double local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  vec<double,_3> local_48;
  double local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  CubeVoid voidSDF;
  SDF_CubeVoid_Test *this_local;
  
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  linalg::vec<double,_3>::vec(&local_48,&local_50,&local_58,&local_60);
  p.y = local_48.y;
  p.x = local_48.x;
  p.z = local_48.z;
  local_30 = CubeVoid::operator()
                       ((CubeVoid *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 7),p);
  local_64 = -1;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_28,"voidSDF({0, 0, 0})","-1",&local_30,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_c0 = 0.0;
  local_c8 = 0.0;
  local_d0 = 1.0;
  linalg::vec<double,_3>::vec(&local_b8,&local_c0,&local_c8,&local_d0);
  p_00.y = local_b8.y;
  p_00.x = local_b8.x;
  p_00.z = local_b8.z;
  local_a0 = CubeVoid::operator()
                       ((CubeVoid *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 7),p_00);
  local_d4 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_98,"voidSDF({0, 0, 1})","0",&local_a0,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_120 = 0.0;
  local_128 = 1.0;
  local_130 = 1.0;
  linalg::vec<double,_3>::vec(&local_118,&local_120,&local_128,&local_130);
  p_01.y = local_118.y;
  p_01.x = local_118.x;
  p_01.z = local_118.z;
  local_100 = CubeVoid::operator()
                        ((CubeVoid *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),p_01);
  local_134 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_f8,"voidSDF({0, 1, 1})","0",&local_100,&local_134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_180 = -1.0;
  local_188 = 0.0;
  local_190 = 0.0;
  linalg::vec<double,_3>::vec(&local_178,&local_180,&local_188,&local_190);
  p_02.y = local_178.y;
  p_02.x = local_178.x;
  p_02.z = local_178.z;
  local_160 = CubeVoid::operator()
                        ((CubeVoid *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),p_02);
  local_194 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_158,"voidSDF({-1, 0, 0})","0",&local_160,&local_194);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_1e0 = 1.0;
  local_1e8 = 1.0;
  local_1f0 = -1.0;
  linalg::vec<double,_3>::vec(&local_1d8,&local_1e0,&local_1e8,&local_1f0);
  p_03.y = local_1d8.y;
  p_03.x = local_1d8.x;
  p_03.z = local_1d8.z;
  local_1c0 = CubeVoid::operator()
                        ((CubeVoid *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),p_03);
  local_1f4 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_1b8,"voidSDF({1, 1, -1})","0",&local_1c0,&local_1f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_240 = 2.0;
  local_248 = 0.0;
  local_250 = 0.0;
  linalg::vec<double,_3>::vec(&local_238,&local_240,&local_248,&local_250);
  p_04.y = local_238.y;
  p_04.x = local_238.x;
  p_04.z = local_238.z;
  local_220 = CubeVoid::operator()
                        ((CubeVoid *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),p_04);
  local_254 = 1;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_218,"voidSDF({2, 0, 0})","1",&local_220,&local_254);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_2a0 = 2.0;
  local_2a8 = -2.0;
  local_2b0 = 0.0;
  linalg::vec<double,_3>::vec(&local_298,&local_2a0,&local_2a8,&local_2b0);
  p_05.y = local_298.y;
  p_05.x = local_298.x;
  p_05.z = local_298.z;
  local_280 = CubeVoid::operator()
                        ((CubeVoid *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),p_05);
  local_2b4 = 1;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_278,"voidSDF({2, -2, 0})","1",&local_280,&local_2b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_300 = -2.0;
  local_308 = 2.0;
  local_310 = 2.0;
  linalg::vec<double,_3>::vec(&local_2f8,&local_300,&local_308,&local_310);
  p_06.y = local_2f8.y;
  p_06.x = local_2f8.x;
  p_06.z = local_2f8.z;
  local_2e0 = CubeVoid::operator()
                        ((CubeVoid *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),p_06);
  local_314 = 1;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_2d8,"voidSDF({-2, 2, 2})","1",&local_2e0,&local_314);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/sdf_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  return;
}

Assistant:

TEST(SDF, CubeVoid) {
  CubeVoid voidSDF;

  EXPECT_EQ(voidSDF({0, 0, 0}), -1);
  EXPECT_EQ(voidSDF({0, 0, 1}), 0);
  EXPECT_EQ(voidSDF({0, 1, 1}), 0);
  EXPECT_EQ(voidSDF({-1, 0, 0}), 0);
  EXPECT_EQ(voidSDF({1, 1, -1}), 0);
  EXPECT_EQ(voidSDF({2, 0, 0}), 1);
  EXPECT_EQ(voidSDF({2, -2, 0}), 1);
  EXPECT_EQ(voidSDF({-2, 2, 2}), 1);
}